

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

void __thiscall
PSVIWriterHandlers::processValueConstraint
          (PSVIWriterHandlers *this,VALUE_CONSTRAINT valueConstraintType,XMLCh *constraintValue)

{
  XMLCh *value;
  
  if (valueConstraintType != VALUE_CONSTRAINT_NONE) {
    sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValueConstraint);
    if (valueConstraintType == VALUE_CONSTRAINT_FIXED) {
      value = (XMLCh *)&xercesc_4_0::PSVIUni::fgVCFixed;
    }
    else {
      value = (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
    }
    if (valueConstraintType == VALUE_CONSTRAINT_DEFAULT) {
      value = (XMLCh *)&xercesc_4_0::PSVIUni::fgDefault;
    }
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgVariety,value);
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValue,constraintValue);
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValueConstraint);
    return;
  }
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValueConstraint);
  return;
}

Assistant:

void PSVIWriterHandlers::processValueConstraint(XSConstants::VALUE_CONSTRAINT valueConstraintType, const XMLCh* constraintValue) {
	if (valueConstraintType == XSConstants::VALUE_CONSTRAINT_NONE) {
		sendElementEmpty(PSVIUni::fgValueConstraint);
	} else {
		sendIndentedElement(PSVIUni::fgValueConstraint);
		sendElementValue(PSVIUni::fgVariety, translateValueConstraint(valueConstraintType));
		sendElementValue(PSVIUni::fgValue, constraintValue);
		sendUnindentedElement(PSVIUni::fgValueConstraint);
	}
}